

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O0

void processContentSpecNode(ContentSpecNode *cSpecNode,bool margin)

{
  NodeTypes NVar1;
  bool margin_local;
  ContentSpecNode *cSpecNode_local;
  
  if (cSpecNode != (ContentSpecNode *)0x0) {
    if (margin) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    std::operator<<((ostream *)&std::cout,"ContentType:\t");
    NVar1 = xercesc_4_0::ContentSpecNode::getType(cSpecNode);
    switch(NVar1) {
    case Leaf:
      std::operator<<((ostream *)&std::cout,"Leaf");
      break;
    case ZeroOrOne:
      std::operator<<((ostream *)&std::cout,"ZeroOrOne");
      break;
    case ZeroOrMore:
      std::operator<<((ostream *)&std::cout,"ZeroOrMore");
      break;
    case OneOrMore:
      std::operator<<((ostream *)&std::cout,"OneOrMore");
      break;
    case Choice:
    case ModelGroupChoice:
      std::operator<<((ostream *)&std::cout,"Choice");
      break;
    case Sequence:
    case ModelGroupSequence:
      std::operator<<((ostream *)&std::cout,"Sequence");
      break;
    case Any:
      std::operator<<((ostream *)&std::cout,"Any");
      break;
    case Any_Other:
      std::operator<<((ostream *)&std::cout,"Any_Other");
      break;
    case Any_NS:
      std::operator<<((ostream *)&std::cout,"Any_NS");
      break;
    case All:
      std::operator<<((ostream *)&std::cout,"All");
      break;
    case Loop:
      std::operator<<((ostream *)&std::cout,"Loop");
      break;
    case Any_NS_Choice:
      std::operator<<((ostream *)&std::cout,"Any_NS_Choice");
      break;
    case Any_Lax:
      std::operator<<((ostream *)&std::cout,"Any_Lax");
      break;
    case Any_Other_Lax:
      std::operator<<((ostream *)&std::cout,"Any_Other_Lax");
      break;
    case Any_NS_Lax:
      std::operator<<((ostream *)&std::cout,"Any_NS_Lax");
      break;
    case Any_Skip:
      std::operator<<((ostream *)&std::cout,"Any_Skip");
      break;
    case Any_Other_Skip:
      std::operator<<((ostream *)&std::cout,"Any_Other_Skip");
      break;
    case Any_NS_Skip:
      std::operator<<((ostream *)&std::cout,"Any_NS_Skip");
      break;
    case UnknownType:
      std::operator<<((ostream *)&std::cout,"UnknownType");
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  return;
}

Assistant:

void processContentSpecNode( const ContentSpecNode* cSpecNode, bool margin )
{
    if( !cSpecNode )
    {
        return;
    }

    if( margin )
    {
        std::cout << "\t";
    }

    std::cout << "ContentType:\t";
    switch( cSpecNode->getType() )
    {
        case ContentSpecNode::Leaf:                std::cout << "Leaf";           break;
        case ContentSpecNode::ZeroOrOne:           std::cout << "ZeroOrOne";      break;
        case ContentSpecNode::ZeroOrMore:          std::cout << "ZeroOrMore";     break;
        case ContentSpecNode::OneOrMore:           std::cout << "OneOrMore";      break;
        case ContentSpecNode::ModelGroupChoice:    
        case ContentSpecNode::Choice:              std::cout << "Choice";         break;
        case ContentSpecNode::ModelGroupSequence:  
        case ContentSpecNode::Sequence:            std::cout << "Sequence";       break;
        case ContentSpecNode::All:                 std::cout << "All";            break;
        case ContentSpecNode::Loop:                std::cout << "Loop";           break;
        case ContentSpecNode::Any:                 std::cout << "Any";            break;
        case ContentSpecNode::Any_Other:           std::cout << "Any_Other";      break;
        case ContentSpecNode::Any_NS:              std::cout << "Any_NS";         break;
        case ContentSpecNode::Any_Lax:             std::cout << "Any_Lax";        break;
        case ContentSpecNode::Any_Other_Lax:       std::cout << "Any_Other_Lax";  break;
        case ContentSpecNode::Any_NS_Lax:          std::cout << "Any_NS_Lax";     break;
        case ContentSpecNode::Any_Skip:            std::cout << "Any_Skip";       break;
        case ContentSpecNode::Any_Other_Skip:      std::cout << "Any_Other_Skip"; break;
        case ContentSpecNode::Any_NS_Skip:         std::cout << "Any_NS_Skip";    break;
        case ContentSpecNode::Any_NS_Choice:       std::cout << "Any_NS_Choice";  break;
        case ContentSpecNode::UnknownType:         std::cout << "UnknownType";    break;
    }
    std::cout << "\n";
}